

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

uint32_t __thiscall spvtools::opt::Module::GetExtInstImportId(Module *this,char *extstr)

{
  int iVar1;
  uint32_t uVar2;
  Operand *this_00;
  Instruction *this_01;
  Instruction *pIVar3;
  string local_50;
  
  this_01 = (this->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  pIVar3 = &(this->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (this_01 != pIVar3) {
    do {
      this_00 = Instruction::GetInOperand(this_01,0);
      Operand::AsString_abi_cxx11_(&local_50,this_00);
      iVar1 = std::__cxx11::string::compare((char *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (iVar1 == 0) {
        if (this_01->has_result_id_ != true) {
          return 0;
        }
        uVar2 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
        return uVar2;
      }
      this_01 = (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (this_01 != pIVar3);
  }
  return 0;
}

Assistant:

uint32_t Module::GetExtInstImportId(const char* extstr) {
  for (auto& ei : ext_inst_imports_)
    if (!ei.GetInOperand(0).AsString().compare(extstr)) return ei.result_id();
  return 0;
}